

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyInsertNodeAtEnd(Node *element,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  node->parent = element;
  if (element != (Node *)0x0) {
    pNVar1 = element->last;
    node->prev = pNVar1;
    ppNVar2 = &pNVar1->next;
    if (pNVar1 == (Node *)0x0) {
      ppNVar2 = &element->content;
    }
    *ppNVar2 = node;
    element->last = node;
    return;
  }
  node->prev = (Node *)0x0;
  return;
}

Assistant:

void TY_(InsertNodeAtEnd)(Node *element, Node *node)
{
    node->parent = element;
    node->prev = element ? element->last : NULL;

    if (element && element->last != NULL)
        element->last->next = node;
    else
        if (element)
            element->content = node;

    if (element)
        element->last = node;
}